

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O3

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,string *file_name,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mesh_files)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Mesh *this;
  byte *pbVar4;
  _Rb_tree_node_base *p_Var5;
  DecoderBuffer buffer;
  string extension;
  vector<char,_std::allocator<char>_> file_data;
  Decoder decoder;
  undefined1 local_260 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [2];
  string local_228;
  vector<char,_std::allocator<char>_> local_208;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  Code local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> local_1a8;
  undefined1 local_178 [8];
  undefined8 local_170;
  _Base_ptr local_168;
  BitDecoder local_160;
  undefined1 local_148 [32];
  _Rb_tree_node_base local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  bool local_88;
  bool local_87;
  BitDecoder local_60 [2];
  
  this = (Mesh *)operator_new(0xd8);
  Mesh::Mesh(this);
  LowercaseFileExtension(&local_228,file_name);
  iVar3 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_228);
    if ((mesh_files !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) && (iVar3 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(mesh_files,file_name);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar3 == 0) {
    ObjDecoder::ObjDecoder((ObjDecoder *)local_178);
    pcVar1 = local_260 + 0x10;
    local_260._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"use_metadata","");
    local_88 = Options::GetBool(options,(string *)local_260,false);
    if ((char *)local_260._0_8_ != pcVar1) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    local_260._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"preserve_polygons","");
    local_87 = Options::GetBool(options,(string *)local_260);
    if ((char *)local_260._0_8_ != pcVar1) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    ObjDecoder::DecodeFromFile
              ((Status *)local_260,(ObjDecoder *)local_178,file_name,this,mesh_files);
    if (local_260._0_4_ == OK) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
      super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this;
      this = (Mesh *)0x0;
    }
    else {
      (__return_storage_ptr__->status_).code_ = local_260._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_260._8_8_,
                 (char *)(local_260._8_8_ + local_260._16_8_));
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
      super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._8_8_ != local_248) {
      operator_delete((void *)local_260._8_8_,(ulong)(local_248[0]._0_8_ + 1));
    }
    DecoderBuffer::BitDecoder::~BitDecoder(local_60);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_c0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_left != &local_108) {
      operator_delete(local_128._M_left,local_108._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_node_base *)local_148._16_8_ == &local_128) goto LAB_00111d96;
    pbVar4 = (byte *)(local_128._0_8_ + 1);
    p_Var5 = (_Rb_tree_node_base *)local_148._16_8_;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_228);
    if (iVar3 == 0) {
      PlyDecoder::PlyDecoder((PlyDecoder *)local_178);
      PlyDecoder::DecodeFromFile((Status *)local_260,(PlyDecoder *)local_178,file_name,this);
      if (local_260._0_4_ == OK) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._8_8_ != local_248) {
          operator_delete((void *)local_260._8_8_,(ulong)(local_248[0]._0_8_ + 1));
        }
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this;
        this = (Mesh *)0x0;
      }
      else {
        (__return_storage_ptr__->status_).code_ = local_260._0_4_;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->status_).error_msg_,local_260._8_8_,
                   (char *)(local_260._8_8_ + local_260._16_8_));
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._8_8_ != local_248) {
          operator_delete((void *)local_260._8_8_,(ulong)(local_248[0]._0_8_ + 1));
        }
      }
      DecoderBuffer::BitDecoder::~BitDecoder(&local_160);
      goto LAB_00111d96;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_228);
    if (iVar3 == 0) {
      StlDecoder::DecodeFromFile(__return_storage_ptr__,(StlDecoder *)local_178,file_name);
      goto LAB_00111d96;
    }
    local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ReadFileToBuffer(file_name,&local_208);
    if (bVar2) {
      DecoderBuffer::DecoderBuffer((DecoderBuffer *)local_260);
      DecoderBuffer::Init((DecoderBuffer *)local_260,
                          local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      local_160.bit_buffer_ = (uint8_t *)&local_170;
      local_170 = (BitDecoder *)((ulong)local_170._4_4_ << 0x20);
      local_168 = (_Base_ptr)0x0;
      local_160.bit_offset_ = 0;
      local_148._24_8_ = local_148 + 8;
      local_148._8_4_ = _S_red;
      local_148._16_8_ = (_Rb_tree_node_base *)0x0;
      local_128._M_parent = (_Base_ptr)0x0;
      local_160.bit_buffer_end_ = local_160.bit_buffer_;
      local_128._0_8_ = local_148._24_8_;
      Decoder::DecodeMeshFromBuffer(&local_1a8,(Decoder *)local_178,(DecoderBuffer *)local_260);
      if ((local_1a8.status_.code_ == OK) &&
         ((_Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>)
          local_1a8.value_._M_t.
          super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
          super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
          super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl != (Mesh *)0x0)) {
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
             (Mesh *)local_1a8.value_._M_t.
                     super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                     super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                     super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
      }
      else {
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"Error decoding input.","");
        local_1d0 = DRACO_ERROR;
        local_1c8 = local_1b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
        (__return_storage_ptr__->status_).code_ = local_1d0;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->status_).error_msg_,local_1c8,
                   local_1c0 + (long)local_1c8);
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        if ((_Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>)
            local_1a8.value_._M_t.
            super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
            super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
            super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl != (Mesh *)0x0) {
          (**(code **)(*(long *)local_1a8.value_._M_t.
                                super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>
                                .super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl + 8))();
        }
      }
      local_1a8.value_._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
      _M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
           (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.status_.error_msg_._M_dataplus._M_p != &local_1a8.status_.error_msg_.field_2)
      {
        operator_delete(local_1a8.status_.error_msg_._M_dataplus._M_p,
                        local_1a8.status_.error_msg_.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<draco::GeometryAttribute::Type,_std::pair<const_draco::GeometryAttribute::Type,_draco::Options>,_std::_Select1st<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
      ::~_Rb_tree((_Rb_tree<draco::GeometryAttribute::Type,_std::pair<const_draco::GeometryAttribute::Type,_draco::Options>,_std::_Select1st<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
                   *)local_148);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_178);
      DecoderBuffer::BitDecoder::~BitDecoder((BitDecoder *)local_248);
    }
    else {
      local_260._0_8_ = local_260 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Unable to read input file.","");
      local_178._0_4_ = DRACO_ERROR;
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_260._0_8_,(char *)(local_260._8_8_ + local_260._0_8_));
      (__return_storage_ptr__->status_).code_ = local_178._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_170,
                 (long)&local_168->_M_color + (long)local_170);
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
      super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
      if (local_170 != &local_160) {
        operator_delete(local_170,(ulong)((long)(_Rb_tree_color *)local_160.bit_buffer_ + 1));
      }
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
    }
    if ((_Rb_tree_node_base *)
        local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (_Rb_tree_node_base *)0x0) goto LAB_00111d96;
    pbVar4 = (byte *)(local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage +
                     -(long)local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    p_Var5 = (_Rb_tree_node_base *)
             local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  operator_delete(p_Var5,(ulong)pbVar4);
LAB_00111d96:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (this != (Mesh *)0x0) {
    (*(this->super_PointCloud)._vptr_PointCloud[1])(this);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(
    const std::string &file_name, const Options &options,
    std::vector<std::string> *mesh_files) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  // Analyze file extension.
  const std::string extension = LowercaseFileExtension(file_name);
  if (extension != "gltf" && extension != "obj" && mesh_files) {
    // The GLTF/OBJ decoder will fill |mesh_files|, but for other file types we
    // set the root file here to avoid duplicating code.
    mesh_files->push_back(file_name);
  }
  if (extension == "obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    obj_decoder.set_use_metadata(options.GetBool("use_metadata", false));
    obj_decoder.set_preserve_polygons(options.GetBool("preserve_polygons"));
    const Status obj_status =
        obj_decoder.DecodeFromFile(file_name, mesh.get(), mesh_files);
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(mesh);
  }
  if (extension == "ply") {
    // Stanford PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, mesh.get()));
    return std::move(mesh);
  }
  if (extension == "stl") {
    // STL file format.
    StlDecoder stl_decoder;
    return stl_decoder.DecodeFromFile(file_name);
  }
#ifdef DRACO_TRANSCODER_SUPPORTED
  if (extension == "gltf" || extension == "glb") {
    GltfDecoder gltf_decoder;
    return gltf_decoder.DecodeFromFile(file_name, mesh_files);
  }
#endif

  // Otherwise not an obj file. Assume the file was encoded with one of the
  // draco encoding methods.
  std::vector<char> file_data;
  if (!ReadFileToBuffer(file_name, &file_data)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(file_data.data(), file_data.size());
  Decoder decoder;
  auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
  if (!statusor.ok() || statusor.value() == nullptr) {
    return Status(Status::DRACO_ERROR, "Error decoding input.");
  }
  return std::move(statusor).value();
}